

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_1,_false,_embree::avx::SubGridIntersector1Moeller<4,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  RTCFilterFunctionN p_Var6;
  RTCIntersectArguments *pRVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined4 uVar55;
  float fVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined4 uVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  byte bVar73;
  int iVar74;
  undefined4 uVar75;
  ulong uVar76;
  long lVar77;
  long lVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  long lVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  float fVar89;
  float fVar97;
  float fVar98;
  vint4 ai_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vint4 ai;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar121;
  float fVar122;
  vint4 ai_3;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar127;
  float fVar138;
  float fVar139;
  vint4 ai_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar163;
  uint uVar168;
  uint uVar170;
  float fVar171;
  uint uVar172;
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar169;
  float fVar173;
  uint uVar174;
  float fVar175;
  uint uVar176;
  float fVar177;
  uint uVar178;
  uint uVar179;
  undefined1 auVar166 [64];
  float fVar180;
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  float fVar189;
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_be4;
  Geometry *local_be0;
  ulong local_bd8;
  ulong local_bd0;
  ulong local_bc8;
  ulong local_bc0;
  ulong local_bb8;
  ulong local_bb0;
  ulong *local_ba8;
  ulong local_ba0;
  ulong local_b98;
  ulong local_b90;
  ulong local_b88;
  ulong local_b80;
  ulong local_b78;
  long local_b70;
  long local_b68;
  ulong local_b60;
  ulong local_b58;
  long local_b50;
  long local_b48;
  float local_b40;
  float local_b3c;
  float local_b38;
  undefined4 local_b34;
  float local_b30;
  uint local_b2c;
  uint local_b28;
  uint local_b24;
  uint local_b20;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  uint uStack_864;
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800;
  ulong local_7f8 [249];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar112 = ray->tfar;
    if (0.0 <= fVar112) {
      local_ba8 = local_7f8;
      aVar1 = (ray->dir).field_0;
      auVar90 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar92._8_4_ = 0x7fffffff;
      auVar92._0_8_ = 0x7fffffff7fffffff;
      auVar92._12_4_ = 0x7fffffff;
      auVar92 = vandps_avx((undefined1  [16])aVar1,auVar92);
      auVar150._8_4_ = 0x219392ef;
      auVar150._0_8_ = 0x219392ef219392ef;
      auVar150._12_4_ = 0x219392ef;
      auVar92 = vcmpps_avx(auVar92,auVar150,1);
      auVar92 = vblendvps_avx((undefined1  [16])aVar1,auVar150,auVar92);
      auVar150 = vrcpps_avx(auVar92);
      fVar98 = auVar150._0_4_;
      auVar128._0_4_ = fVar98 * auVar92._0_4_;
      fVar99 = auVar150._4_4_;
      auVar128._4_4_ = fVar99 * auVar92._4_4_;
      fVar100 = auVar150._8_4_;
      auVar128._8_4_ = fVar100 * auVar92._8_4_;
      fVar102 = auVar150._12_4_;
      auVar128._12_4_ = fVar102 * auVar92._12_4_;
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = 0x3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar92 = vsubps_avx(auVar151,auVar128);
      auVar129._0_4_ = fVar98 + fVar98 * auVar92._0_4_;
      auVar129._4_4_ = fVar99 + fVar99 * auVar92._4_4_;
      auVar129._8_4_ = fVar100 + fVar100 * auVar92._8_4_;
      auVar129._12_4_ = fVar102 + fVar102 * auVar92._12_4_;
      uVar68 = *(undefined4 *)&(ray->org).field_0;
      local_9f0._4_4_ = uVar68;
      local_9f0._0_4_ = uVar68;
      local_9f0._8_4_ = uVar68;
      local_9f0._12_4_ = uVar68;
      auVar160 = ZEXT1664(local_9f0);
      uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_a00._4_4_ = uVar68;
      local_a00._0_4_ = uVar68;
      local_a00._8_4_ = uVar68;
      local_a00._12_4_ = uVar68;
      auVar162 = ZEXT1664(local_a00);
      uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_a10._4_4_ = uVar68;
      local_a10._0_4_ = uVar68;
      local_a10._8_4_ = uVar68;
      local_a10._12_4_ = uVar68;
      auVar166 = ZEXT1664(local_a10);
      local_a20 = vshufps_avx(auVar129,auVar129,0);
      auVar182 = ZEXT1664(local_a20);
      auVar92 = vmovshdup_avx(auVar129);
      local_a30 = vshufps_avx(auVar129,auVar129,0x55);
      auVar191 = ZEXT1664(local_a30);
      auVar150 = vshufpd_avx(auVar129,auVar129,1);
      local_a40 = vshufps_avx(auVar129,auVar129,0xaa);
      auVar199 = ZEXT1664(local_a40);
      local_bb0 = (ulong)(auVar129._0_4_ < 0.0) << 4;
      local_bb8 = (ulong)(auVar92._0_4_ < 0.0) << 4 | 0x20;
      local_bc0 = (ulong)(auVar150._0_4_ < 0.0) << 4 | 0x40;
      local_bc8 = local_bb0 ^ 0x10;
      local_bd0 = local_bb8 ^ 0x10;
      local_bd8 = local_bc0 ^ 0x10;
      local_a50 = vshufps_avx(auVar90,auVar90,0);
      auVar201 = ZEXT1664(local_a50);
      local_a60 = vshufps_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),0);
      auVar203 = ZEXT1664(local_a60);
      local_b78 = (ulong)(((uint)(auVar129._0_4_ < 0.0) << 4) >> 2);
      local_b80 = local_bc8 >> 2;
      local_b88 = local_bb8 >> 2;
      local_b90 = local_bd0 >> 2;
      local_b98 = local_bc0 >> 2;
      local_9e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_9e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_9a0 = vperm2f128_avx(local_9e0,mm_lookupmask_ps._0_32_,2);
      local_ba0 = local_bd8 >> 2;
      auVar95._8_4_ = 0xbf800000;
      auVar95._0_8_ = 0xbf800000bf800000;
      auVar95._12_4_ = 0xbf800000;
      auVar95._16_4_ = 0xbf800000;
      auVar95._20_4_ = 0xbf800000;
      auVar95._24_4_ = 0xbf800000;
      auVar95._28_4_ = 0xbf800000;
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = 0x3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar118._16_4_ = 0x3f800000;
      auVar118._20_4_ = 0x3f800000;
      auVar118._24_4_ = 0x3f800000;
      auVar118._28_4_ = 0x3f800000;
      _local_9c0 = vblendvps_avx(auVar118,auVar95,local_9a0);
      uVar88 = local_bc8;
      uVar70 = local_bb0;
      uVar72 = local_bb8;
      uVar83 = local_bc0;
      uVar84 = local_bd8;
      uVar87 = local_bd0;
LAB_002cccc2:
      do {
        uVar86 = local_ba8[-1];
        local_ba8 = local_ba8 + -1;
        while ((uVar86 & 8) == 0) {
          auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar70),auVar160._0_16_);
          auVar90._0_4_ = auVar182._0_4_ * auVar92._0_4_;
          auVar90._4_4_ = auVar182._4_4_ * auVar92._4_4_;
          auVar90._8_4_ = auVar182._8_4_ * auVar92._8_4_;
          auVar90._12_4_ = auVar182._12_4_ * auVar92._12_4_;
          auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar72),auVar162._0_16_);
          auVar105._0_4_ = auVar191._0_4_ * auVar92._0_4_;
          auVar105._4_4_ = auVar191._4_4_ * auVar92._4_4_;
          auVar105._8_4_ = auVar191._8_4_ * auVar92._8_4_;
          auVar105._12_4_ = auVar191._12_4_ * auVar92._12_4_;
          auVar92 = vpmaxsd_avx(auVar90,auVar105);
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar83),auVar166._0_16_);
          auVar106._0_4_ = auVar199._0_4_ * auVar90._0_4_;
          auVar106._4_4_ = auVar199._4_4_ * auVar90._4_4_;
          auVar106._8_4_ = auVar199._8_4_ * auVar90._8_4_;
          auVar106._12_4_ = auVar199._12_4_ * auVar90._12_4_;
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar88),auVar160._0_16_);
          auVar113._0_4_ = auVar182._0_4_ * auVar90._0_4_;
          auVar113._4_4_ = auVar182._4_4_ * auVar90._4_4_;
          auVar113._8_4_ = auVar182._8_4_ * auVar90._8_4_;
          auVar113._12_4_ = auVar182._12_4_ * auVar90._12_4_;
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar87),auVar162._0_16_);
          auVar130._0_4_ = auVar191._0_4_ * auVar90._0_4_;
          auVar130._4_4_ = auVar191._4_4_ * auVar90._4_4_;
          auVar130._8_4_ = auVar191._8_4_ * auVar90._8_4_;
          auVar130._12_4_ = auVar191._12_4_ * auVar90._12_4_;
          auVar150 = vpminsd_avx(auVar113,auVar130);
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar86 + 0x20 + uVar84),auVar166._0_16_);
          auVar131._0_4_ = auVar199._0_4_ * auVar90._0_4_;
          auVar131._4_4_ = auVar199._4_4_ * auVar90._4_4_;
          auVar131._8_4_ = auVar199._8_4_ * auVar90._8_4_;
          auVar131._12_4_ = auVar199._12_4_ * auVar90._12_4_;
          auVar90 = vpmaxsd_avx(auVar106,auVar201._0_16_);
          auVar92 = vpmaxsd_avx(auVar92,auVar90);
          auVar90 = vpminsd_avx(auVar131,auVar203._0_16_);
          auVar90 = vpminsd_avx(auVar150,auVar90);
          auVar92 = vpcmpgtd_avx(auVar92,auVar90);
          iVar74 = vmovmskps_avx(auVar92);
          if (iVar74 == 0xf) {
            if (local_ba8 == &local_800) {
              return;
            }
            goto LAB_002cccc2;
          }
          bVar73 = (byte)iVar74 ^ 0xf;
          uVar69 = uVar86 & 0xfffffffffffffff0;
          lVar77 = 0;
          if (bVar73 != 0) {
            for (; (bVar73 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
            }
          }
          uVar86 = *(ulong *)(uVar69 + lVar77 * 8);
          uVar79 = bVar73 - 1 & (uint)bVar73;
          if (uVar79 != 0) {
            *local_ba8 = uVar86;
            local_ba8 = local_ba8 + 1;
            lVar77 = 0;
            if (uVar79 != 0) {
              for (; (uVar79 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
              }
            }
            uVar86 = *(ulong *)(uVar69 + lVar77 * 8);
            uVar79 = uVar79 - 1 & uVar79;
            uVar76 = (ulong)uVar79;
            if (uVar79 != 0) {
              do {
                *local_ba8 = uVar86;
                local_ba8 = local_ba8 + 1;
                lVar77 = 0;
                if (uVar76 != 0) {
                  for (; (uVar76 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
                  }
                }
                uVar86 = *(ulong *)(uVar69 + lVar77 * 8);
                uVar76 = uVar76 & uVar76 - 1;
              } while (uVar76 != 0);
            }
          }
        }
        local_b70 = (ulong)((uint)uVar86 & 0xf) - 8;
        if (local_b70 != 0) {
          uVar86 = uVar86 & 0xfffffffffffffff0;
          local_b68 = 0;
          do {
            lVar77 = local_b68 * 0x58;
            local_b48 = uVar86 + lVar77;
            auVar91._8_8_ = 0;
            auVar91._0_8_ = *(ulong *)(uVar86 + 0x20 + lVar77);
            auVar107._8_8_ = 0;
            auVar107._0_8_ = *(ulong *)(uVar86 + 0x24 + lVar77);
            auVar90 = vpminub_avx(auVar91,auVar107);
            auVar92 = vpcmpeqb_avx(auVar91,auVar90);
            auVar90 = vpcmpeqd_avx(auVar90,auVar90);
            auVar92 = vpmovzxbd_avx(auVar92 ^ auVar90);
            auVar92 = vpslld_avx(auVar92 ^ auVar90,0x1f);
            uVar68 = vmovmskps_avx(auVar92);
            fVar112 = *(float *)(uVar86 + 0x38 + lVar77);
            fVar98 = *(float *)(uVar86 + 0x44 + lVar77);
            auVar114._8_8_ = 0;
            auVar114._0_8_ = *(ulong *)(local_b78 + 0x20 + local_b48);
            auVar92 = vpmovzxbd_avx(auVar114);
            auVar92 = vcvtdq2ps_avx(auVar92);
            auVar115._0_4_ = fVar112 + fVar98 * auVar92._0_4_;
            auVar115._4_4_ = fVar112 + fVar98 * auVar92._4_4_;
            auVar115._8_4_ = fVar112 + fVar98 * auVar92._8_4_;
            auVar115._12_4_ = fVar112 + fVar98 * auVar92._12_4_;
            auVar132._8_8_ = 0;
            auVar132._0_8_ = *(ulong *)(local_b80 + 0x20 + local_b48);
            auVar92 = vpmovzxbd_avx(auVar132);
            auVar92 = vcvtdq2ps_avx(auVar92);
            auVar93._0_4_ = fVar112 + fVar98 * auVar92._0_4_;
            auVar93._4_4_ = fVar112 + fVar98 * auVar92._4_4_;
            auVar93._8_4_ = fVar112 + fVar98 * auVar92._8_4_;
            auVar93._12_4_ = fVar112 + fVar98 * auVar92._12_4_;
            fVar112 = *(float *)(uVar86 + 0x3c + lVar77);
            fVar98 = *(float *)(uVar86 + 0x48 + lVar77);
            auVar144._8_8_ = 0;
            auVar144._0_8_ = *(ulong *)(local_b88 + 0x20 + local_b48);
            auVar92 = vpmovzxbd_avx(auVar144);
            auVar92 = vcvtdq2ps_avx(auVar92);
            auVar145._0_4_ = fVar112 + fVar98 * auVar92._0_4_;
            auVar145._4_4_ = fVar112 + fVar98 * auVar92._4_4_;
            auVar145._8_4_ = fVar112 + fVar98 * auVar92._8_4_;
            auVar145._12_4_ = fVar112 + fVar98 * auVar92._12_4_;
            auVar152._8_8_ = 0;
            auVar152._0_8_ = *(ulong *)(local_b90 + 0x20 + local_b48);
            auVar92 = vpmovzxbd_avx(auVar152);
            auVar92 = vcvtdq2ps_avx(auVar92);
            auVar108._0_4_ = fVar112 + fVar98 * auVar92._0_4_;
            auVar108._4_4_ = fVar112 + fVar98 * auVar92._4_4_;
            auVar108._8_4_ = fVar112 + fVar98 * auVar92._8_4_;
            auVar108._12_4_ = fVar112 + fVar98 * auVar92._12_4_;
            fVar112 = *(float *)(uVar86 + 0x4c + lVar77);
            auVar153._8_8_ = 0;
            auVar153._0_8_ = *(ulong *)(local_b98 + 0x20 + local_b48);
            auVar92 = vpmovzxbd_avx(auVar153);
            auVar92 = vcvtdq2ps_avx(auVar92);
            auVar156._8_8_ = 0;
            auVar156._0_8_ = *(ulong *)(local_ba0 + 0x20 + local_b48);
            auVar90 = vpmovzxbd_avx(auVar156);
            auVar90 = vcvtdq2ps_avx(auVar90);
            fVar98 = *(float *)(uVar86 + 0x40 + lVar77);
            auVar154._0_4_ = fVar98 + fVar112 * auVar92._0_4_;
            auVar154._4_4_ = fVar98 + fVar112 * auVar92._4_4_;
            auVar154._8_4_ = fVar98 + fVar112 * auVar92._8_4_;
            auVar154._12_4_ = fVar98 + fVar112 * auVar92._12_4_;
            auVar133._0_4_ = fVar98 + fVar112 * auVar90._0_4_;
            auVar133._4_4_ = fVar98 + fVar112 * auVar90._4_4_;
            auVar133._8_4_ = fVar98 + fVar112 * auVar90._8_4_;
            auVar133._12_4_ = fVar98 + fVar112 * auVar90._12_4_;
            auVar92 = vsubps_avx(auVar115,auVar160._0_16_);
            auVar116._0_4_ = auVar182._0_4_ * auVar92._0_4_;
            auVar116._4_4_ = auVar182._4_4_ * auVar92._4_4_;
            auVar116._8_4_ = auVar182._8_4_ * auVar92._8_4_;
            auVar116._12_4_ = auVar182._12_4_ * auVar92._12_4_;
            auVar92 = vsubps_avx(auVar145,auVar162._0_16_);
            auVar146._0_4_ = auVar191._0_4_ * auVar92._0_4_;
            auVar146._4_4_ = auVar191._4_4_ * auVar92._4_4_;
            auVar146._8_4_ = auVar191._8_4_ * auVar92._8_4_;
            auVar146._12_4_ = auVar191._12_4_ * auVar92._12_4_;
            auVar92 = vpmaxsd_avx(auVar116,auVar146);
            auVar90 = vsubps_avx(auVar93,auVar160._0_16_);
            auVar94._0_4_ = auVar182._0_4_ * auVar90._0_4_;
            auVar94._4_4_ = auVar182._4_4_ * auVar90._4_4_;
            auVar94._8_4_ = auVar182._8_4_ * auVar90._8_4_;
            auVar94._12_4_ = auVar182._12_4_ * auVar90._12_4_;
            auVar90 = vsubps_avx(auVar108,auVar162._0_16_);
            auVar109._0_4_ = auVar191._0_4_ * auVar90._0_4_;
            auVar109._4_4_ = auVar191._4_4_ * auVar90._4_4_;
            auVar109._8_4_ = auVar191._8_4_ * auVar90._8_4_;
            auVar109._12_4_ = auVar191._12_4_ * auVar90._12_4_;
            auVar150 = vpminsd_avx(auVar94,auVar109);
            auVar90 = vsubps_avx(auVar154,auVar166._0_16_);
            auVar110._0_4_ = auVar199._0_4_ * auVar90._0_4_;
            auVar110._4_4_ = auVar199._4_4_ * auVar90._4_4_;
            auVar110._8_4_ = auVar199._8_4_ * auVar90._8_4_;
            auVar110._12_4_ = auVar199._12_4_ * auVar90._12_4_;
            auVar90 = vpmaxsd_avx(auVar110,auVar201._0_16_);
            auVar92 = vpmaxsd_avx(auVar92,auVar90);
            auVar90 = vsubps_avx(auVar133,auVar166._0_16_);
            auVar117._0_4_ = auVar199._0_4_ * auVar90._0_4_;
            auVar117._4_4_ = auVar199._4_4_ * auVar90._4_4_;
            auVar117._8_4_ = auVar199._8_4_ * auVar90._8_4_;
            auVar117._12_4_ = auVar199._12_4_ * auVar90._12_4_;
            auVar90 = vpminsd_avx(auVar117,auVar203._0_16_);
            auVar90 = vpminsd_avx(auVar150,auVar90);
            auVar92 = vpcmpgtd_avx(auVar92,auVar90);
            uVar75 = vmovmskps_avx(auVar92);
            bVar73 = ~(byte)uVar75 & (byte)uVar68;
            if (bVar73 != 0) {
              uVar88 = (ulong)bVar73;
              do {
                lVar77 = 0;
                if (uVar88 != 0) {
                  for (; (uVar88 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
                  }
                }
                uVar3 = *(ushort *)(local_b48 + lVar77 * 8);
                uVar4 = *(ushort *)(local_b48 + 2 + lVar77 * 8);
                uVar79 = *(uint *)(local_b48 + 0x50);
                uVar5 = *(uint *)(local_b48 + 4 + lVar77 * 8);
                local_b58 = (ulong)uVar79;
                local_be0 = (context->scene->geometries).items[uVar79].ptr;
                local_b50 = *(long *)&local_be0->field_0x58;
                local_b60 = (ulong)uVar5;
                lVar78 = local_be0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * (ulong)uVar5;
                uVar81 = uVar3 & 0x7fff;
                uVar82 = uVar4 & 0x7fff;
                uVar80 = *(uint *)(local_b50 + 4 + lVar78);
                uVar83 = (ulong)uVar80;
                uVar72 = (ulong)(uVar80 * uVar82 + *(int *)(local_b50 + lVar78) + uVar81);
                p_Var6 = local_be0[1].intersectionFilterN;
                lVar77 = *(long *)&local_be0[1].time_range.upper;
                auVar92 = *(undefined1 (*) [16])(lVar77 + (long)p_Var6 * uVar72);
                auVar90 = *(undefined1 (*) [16])(lVar77 + (uVar72 + 1) * (long)p_Var6);
                auVar150 = *(undefined1 (*) [16])(lVar77 + (uVar72 + uVar83) * (long)p_Var6);
                lVar85 = uVar72 + uVar83 + 1;
                auVar128 = *(undefined1 (*) [16])(lVar77 + lVar85 * (long)p_Var6);
                uVar70 = (ulong)(-1 < (short)uVar3);
                auVar129 = *(undefined1 (*) [16])(lVar77 + (uVar72 + uVar70 + 1) * (long)p_Var6);
                lVar71 = uVar70 + lVar85;
                auVar151 = *(undefined1 (*) [16])(lVar77 + lVar71 * (long)p_Var6);
                uVar70 = 0;
                if (-1 < (short)uVar4) {
                  uVar70 = uVar83;
                }
                auVar105 = *(undefined1 (*) [16])
                            (lVar77 + (uVar72 + uVar83 + uVar70) * (long)p_Var6);
                auVar106 = *(undefined1 (*) [16])(lVar77 + (lVar85 + uVar70) * (long)p_Var6);
                auVar113 = *(undefined1 (*) [16])(lVar77 + (uVar70 + lVar71) * (long)p_Var6);
                auVar131 = vunpcklps_avx(auVar92,auVar128);
                auVar92 = vunpckhps_avx(auVar92,auVar128);
                auVar91 = vunpcklps_avx(auVar90,auVar150);
                auVar130 = vunpckhps_avx(auVar90,auVar150);
                auVar130 = vunpcklps_avx(auVar92,auVar130);
                auVar93 = vunpcklps_avx(auVar131,auVar91);
                auVar92 = vunpckhps_avx(auVar131,auVar91);
                auVar131 = vunpcklps_avx(auVar90,auVar151);
                auVar90 = vunpckhps_avx(auVar90,auVar151);
                auVar91 = vunpcklps_avx(auVar129,auVar128);
                auVar129 = vunpckhps_avx(auVar129,auVar128);
                auVar94 = vunpcklps_avx(auVar90,auVar129);
                auVar107 = vunpcklps_avx(auVar131,auVar91);
                auVar90 = vunpckhps_avx(auVar131,auVar91);
                auVar131 = vunpcklps_avx(auVar128,auVar113);
                auVar129 = vunpckhps_avx(auVar128,auVar113);
                auVar113 = vunpcklps_avx(auVar151,auVar106);
                auVar151 = vunpckhps_avx(auVar151,auVar106);
                auVar151 = vunpcklps_avx(auVar129,auVar151);
                auVar91 = vunpcklps_avx(auVar131,auVar113);
                auVar129 = vunpckhps_avx(auVar131,auVar113);
                auVar113 = vunpcklps_avx(auVar150,auVar106);
                auVar150 = vunpckhps_avx(auVar150,auVar106);
                auVar106 = vunpcklps_avx(auVar128,auVar105);
                auVar128 = vunpckhps_avx(auVar128,auVar105);
                auVar128 = vunpcklps_avx(auVar150,auVar128);
                auVar105 = vunpcklps_avx(auVar113,auVar106);
                auVar150 = vunpckhps_avx(auVar113,auVar106);
                auVar111._16_16_ = auVar91;
                auVar111._0_16_ = auVar93;
                auVar155._16_16_ = auVar129;
                auVar155._0_16_ = auVar92;
                auVar159._16_16_ = auVar151;
                auVar159._0_16_ = auVar130;
                auVar134._16_16_ = auVar107;
                auVar134._0_16_ = auVar107;
                auVar148._16_16_ = auVar90;
                auVar148._0_16_ = auVar90;
                auVar119._16_16_ = auVar94;
                auVar119._0_16_ = auVar94;
                auVar165._16_16_ = auVar105;
                auVar165._0_16_ = auVar105;
                auVar181._16_16_ = auVar150;
                auVar181._0_16_ = auVar150;
                auVar190._16_16_ = auVar128;
                auVar190._0_16_ = auVar128;
                local_aa0 = vsubps_avx(auVar111,auVar134);
                local_ac0 = vsubps_avx(auVar155,auVar148);
                auVar95 = vsubps_avx(auVar159,auVar119);
                auVar118 = vsubps_avx(auVar165,auVar111);
                auVar96 = vsubps_avx(auVar181,auVar155);
                auVar119 = vsubps_avx(auVar190,auVar159);
                fVar100 = local_ac0._0_4_;
                fVar189 = auVar119._0_4_;
                fVar125 = local_ac0._4_4_;
                fVar192 = auVar119._4_4_;
                auVar51._4_4_ = fVar192 * fVar125;
                auVar51._0_4_ = fVar189 * fVar100;
                fVar89 = local_ac0._8_4_;
                fVar193 = auVar119._8_4_;
                auVar51._8_4_ = fVar193 * fVar89;
                fVar15 = local_ac0._12_4_;
                fVar194 = auVar119._12_4_;
                auVar51._12_4_ = fVar194 * fVar15;
                fVar24 = local_ac0._16_4_;
                fVar195 = auVar119._16_4_;
                auVar51._16_4_ = fVar195 * fVar24;
                fVar33 = local_ac0._20_4_;
                fVar196 = auVar119._20_4_;
                auVar51._20_4_ = fVar196 * fVar33;
                fVar42 = local_ac0._24_4_;
                fVar197 = auVar119._24_4_;
                auVar51._24_4_ = fVar197 * fVar42;
                auVar51._28_4_ = auVar94._12_4_;
                fVar102 = auVar95._0_4_;
                fVar180 = auVar96._0_4_;
                fVar126 = auVar95._4_4_;
                fVar183 = auVar96._4_4_;
                auVar52._4_4_ = fVar183 * fVar126;
                auVar52._0_4_ = fVar180 * fVar102;
                fVar97 = auVar95._8_4_;
                fVar184 = auVar96._8_4_;
                auVar52._8_4_ = fVar184 * fVar97;
                fVar16 = auVar95._12_4_;
                fVar185 = auVar96._12_4_;
                auVar52._12_4_ = fVar185 * fVar16;
                fVar25 = auVar95._16_4_;
                fVar186 = auVar96._16_4_;
                auVar52._16_4_ = fVar186 * fVar25;
                fVar34 = auVar95._20_4_;
                fVar187 = auVar96._20_4_;
                auVar52._20_4_ = fVar187 * fVar34;
                fVar43 = auVar95._24_4_;
                uVar55 = auVar107._12_4_;
                fVar188 = auVar96._24_4_;
                auVar52._24_4_ = fVar188 * fVar43;
                auVar52._28_4_ = uVar55;
                local_a80 = vsubps_avx(auVar52,auVar51);
                fVar163 = auVar118._0_4_;
                fVar167 = auVar118._4_4_;
                auVar53._4_4_ = fVar167 * fVar126;
                auVar53._0_4_ = fVar163 * fVar102;
                fVar169 = auVar118._8_4_;
                auVar53._8_4_ = fVar169 * fVar97;
                fVar171 = auVar118._12_4_;
                auVar53._12_4_ = fVar171 * fVar16;
                fVar173 = auVar118._16_4_;
                auVar53._16_4_ = fVar173 * fVar25;
                fVar175 = auVar118._20_4_;
                auVar53._20_4_ = fVar175 * fVar34;
                fVar177 = auVar118._24_4_;
                auVar53._24_4_ = fVar177 * fVar43;
                auVar53._28_4_ = uVar55;
                fVar104 = local_aa0._0_4_;
                fVar127 = local_aa0._4_4_;
                auVar54._4_4_ = fVar192 * fVar127;
                auVar54._0_4_ = fVar189 * fVar104;
                fVar8 = local_aa0._8_4_;
                auVar54._8_4_ = fVar193 * fVar8;
                fVar17 = local_aa0._12_4_;
                auVar54._12_4_ = fVar194 * fVar17;
                fVar26 = local_aa0._16_4_;
                auVar54._16_4_ = fVar195 * fVar26;
                fVar35 = local_aa0._20_4_;
                auVar54._20_4_ = fVar196 * fVar35;
                fVar44 = local_aa0._24_4_;
                fVar56 = auVar90._12_4_;
                auVar54._24_4_ = fVar197 * fVar44;
                auVar54._28_4_ = fVar56;
                auVar95 = vsubps_avx(auVar54,auVar53);
                auVar57._4_4_ = fVar183 * fVar127;
                auVar57._0_4_ = fVar180 * fVar104;
                auVar57._8_4_ = fVar184 * fVar8;
                auVar57._12_4_ = fVar185 * fVar17;
                auVar57._16_4_ = fVar186 * fVar26;
                auVar57._20_4_ = fVar187 * fVar35;
                auVar57._24_4_ = fVar188 * fVar44;
                auVar57._28_4_ = fVar56;
                auVar58._4_4_ = fVar167 * fVar125;
                auVar58._0_4_ = fVar163 * fVar100;
                auVar58._8_4_ = fVar169 * fVar89;
                auVar58._12_4_ = fVar171 * fVar15;
                auVar58._16_4_ = fVar173 * fVar24;
                auVar58._20_4_ = fVar175 * fVar33;
                auVar58._24_4_ = fVar177 * fVar42;
                auVar58._28_4_ = local_ac0._28_4_;
                local_ae0 = vsubps_avx(auVar58,auVar57);
                uVar68 = *(undefined4 *)&(ray->org).field_0;
                auVar198._4_4_ = uVar68;
                auVar198._0_4_ = uVar68;
                auVar198._8_4_ = uVar68;
                auVar198._12_4_ = uVar68;
                auVar198._16_4_ = uVar68;
                auVar198._20_4_ = uVar68;
                auVar198._24_4_ = uVar68;
                auVar198._28_4_ = uVar68;
                uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
                auVar200._4_4_ = uVar68;
                auVar200._0_4_ = uVar68;
                auVar200._8_4_ = uVar68;
                auVar200._12_4_ = uVar68;
                auVar200._16_4_ = uVar68;
                auVar200._20_4_ = uVar68;
                auVar200._24_4_ = uVar68;
                auVar200._28_4_ = uVar68;
                uVar75 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
                auVar202._4_4_ = uVar75;
                auVar202._0_4_ = uVar75;
                auVar202._8_4_ = uVar75;
                auVar202._12_4_ = uVar75;
                auVar202._16_4_ = uVar75;
                auVar202._20_4_ = uVar75;
                auVar202._24_4_ = uVar75;
                auVar202._28_4_ = uVar75;
                fVar112 = (ray->dir).field_0.m128[1];
                auVar51 = vsubps_avx(auVar111,auVar198);
                fVar98 = (ray->dir).field_0.m128[2];
                auVar52 = vsubps_avx(auVar155,auVar200);
                auVar53 = vsubps_avx(auVar159,auVar202);
                fVar101 = auVar53._0_4_;
                fVar138 = auVar53._4_4_;
                auVar59._4_4_ = fVar112 * fVar138;
                auVar59._0_4_ = fVar112 * fVar101;
                fVar9 = auVar53._8_4_;
                auVar59._8_4_ = fVar112 * fVar9;
                fVar18 = auVar53._12_4_;
                auVar59._12_4_ = fVar112 * fVar18;
                fVar27 = auVar53._16_4_;
                auVar59._16_4_ = fVar112 * fVar27;
                fVar36 = auVar53._20_4_;
                auVar59._20_4_ = fVar112 * fVar36;
                fVar45 = auVar53._24_4_;
                auVar59._24_4_ = fVar112 * fVar45;
                auVar59._28_4_ = uVar68;
                fVar103 = auVar52._0_4_;
                fVar139 = auVar52._4_4_;
                auVar60._4_4_ = fVar98 * fVar139;
                auVar60._0_4_ = fVar98 * fVar103;
                fVar10 = auVar52._8_4_;
                auVar60._8_4_ = fVar98 * fVar10;
                fVar19 = auVar52._12_4_;
                auVar60._12_4_ = fVar98 * fVar19;
                fVar28 = auVar52._16_4_;
                auVar60._16_4_ = fVar98 * fVar28;
                fVar37 = auVar52._20_4_;
                auVar60._20_4_ = fVar98 * fVar37;
                fVar46 = auVar52._24_4_;
                auVar60._24_4_ = fVar98 * fVar46;
                auVar60._28_4_ = uVar75;
                auVar52 = vsubps_avx(auVar60,auVar59);
                fVar99 = (ray->dir).field_0.m128[0];
                fVar121 = auVar51._0_4_;
                fVar140 = auVar51._4_4_;
                auVar61._4_4_ = fVar98 * fVar140;
                auVar61._0_4_ = fVar98 * fVar121;
                fVar11 = auVar51._8_4_;
                auVar61._8_4_ = fVar98 * fVar11;
                fVar20 = auVar51._12_4_;
                auVar61._12_4_ = fVar98 * fVar20;
                fVar29 = auVar51._16_4_;
                auVar61._16_4_ = fVar98 * fVar29;
                fVar38 = auVar51._20_4_;
                auVar61._20_4_ = fVar98 * fVar38;
                fVar47 = auVar51._24_4_;
                auVar61._24_4_ = fVar98 * fVar47;
                auVar61._28_4_ = local_a80._28_4_;
                auVar62._4_4_ = fVar99 * fVar138;
                auVar62._0_4_ = fVar99 * fVar101;
                auVar62._8_4_ = fVar99 * fVar9;
                auVar62._12_4_ = fVar99 * fVar18;
                auVar62._16_4_ = fVar99 * fVar27;
                auVar62._20_4_ = fVar99 * fVar36;
                auVar62._24_4_ = fVar99 * fVar45;
                auVar62._28_4_ = uVar55;
                auVar53 = vsubps_avx(auVar62,auVar61);
                auVar63._4_4_ = fVar99 * fVar139;
                auVar63._0_4_ = fVar99 * fVar103;
                auVar63._8_4_ = fVar99 * fVar10;
                auVar63._12_4_ = fVar99 * fVar19;
                auVar63._16_4_ = fVar99 * fVar28;
                auVar63._20_4_ = fVar99 * fVar37;
                auVar63._24_4_ = fVar99 * fVar46;
                auVar63._28_4_ = uVar55;
                auVar64._4_4_ = fVar112 * fVar140;
                auVar64._0_4_ = fVar112 * fVar121;
                auVar64._8_4_ = fVar112 * fVar11;
                auVar64._12_4_ = fVar112 * fVar20;
                auVar64._16_4_ = fVar112 * fVar29;
                auVar64._20_4_ = fVar112 * fVar38;
                auVar64._24_4_ = fVar112 * fVar47;
                auVar64._28_4_ = fVar56;
                auVar54 = vsubps_avx(auVar64,auVar63);
                fVar122 = local_ae0._0_4_;
                fVar141 = local_ae0._4_4_;
                fVar12 = local_ae0._8_4_;
                fVar21 = local_ae0._12_4_;
                fVar30 = local_ae0._16_4_;
                fVar39 = local_ae0._20_4_;
                fVar48 = local_ae0._24_4_;
                fVar123 = auVar95._0_4_;
                fVar142 = auVar95._4_4_;
                fVar13 = auVar95._8_4_;
                fVar22 = auVar95._12_4_;
                fVar31 = auVar95._16_4_;
                fVar40 = auVar95._20_4_;
                fVar49 = auVar95._24_4_;
                fVar124 = local_a80._0_4_;
                fVar143 = local_a80._4_4_;
                fVar14 = local_a80._8_4_;
                fVar23 = local_a80._12_4_;
                fVar32 = local_a80._16_4_;
                fVar41 = local_a80._20_4_;
                fVar50 = local_a80._24_4_;
                auVar149._0_4_ = fVar99 * fVar124 + fVar112 * fVar123 + fVar98 * fVar122;
                auVar149._4_4_ = fVar99 * fVar143 + fVar112 * fVar142 + fVar98 * fVar141;
                auVar149._8_4_ = fVar99 * fVar14 + fVar112 * fVar13 + fVar98 * fVar12;
                auVar149._12_4_ = fVar99 * fVar23 + fVar112 * fVar22 + fVar98 * fVar21;
                auVar149._16_4_ = fVar99 * fVar32 + fVar112 * fVar31 + fVar98 * fVar30;
                auVar149._20_4_ = fVar99 * fVar41 + fVar112 * fVar40 + fVar98 * fVar39;
                auVar149._24_4_ = fVar99 * fVar50 + fVar112 * fVar49 + fVar98 * fVar48;
                auVar149._28_4_ = fVar98 + fVar98 + fVar56;
                auVar135._8_4_ = 0x80000000;
                auVar135._0_8_ = 0x8000000080000000;
                auVar135._12_4_ = 0x80000000;
                auVar135._16_4_ = 0x80000000;
                auVar135._20_4_ = 0x80000000;
                auVar135._24_4_ = 0x80000000;
                auVar135._28_4_ = 0x80000000;
                auVar95 = vandps_avx(auVar149,auVar135);
                uVar80 = auVar95._0_4_;
                auVar157._0_4_ =
                     (float)(uVar80 ^ (uint)(fVar163 * auVar52._0_4_ +
                                            fVar180 * auVar53._0_4_ + fVar189 * auVar54._0_4_));
                uVar168 = auVar95._4_4_;
                auVar157._4_4_ =
                     (float)(uVar168 ^
                            (uint)(fVar167 * auVar52._4_4_ +
                                  fVar183 * auVar53._4_4_ + fVar192 * auVar54._4_4_));
                uVar170 = auVar95._8_4_;
                auVar157._8_4_ =
                     (float)(uVar170 ^
                            (uint)(fVar169 * auVar52._8_4_ +
                                  fVar184 * auVar53._8_4_ + fVar193 * auVar54._8_4_));
                uVar172 = auVar95._12_4_;
                auVar157._12_4_ =
                     (float)(uVar172 ^
                            (uint)(fVar171 * auVar52._12_4_ +
                                  fVar185 * auVar53._12_4_ + fVar194 * auVar54._12_4_));
                uVar174 = auVar95._16_4_;
                auVar157._16_4_ =
                     (float)(uVar174 ^
                            (uint)(fVar173 * auVar52._16_4_ +
                                  fVar186 * auVar53._16_4_ + fVar195 * auVar54._16_4_));
                uVar176 = auVar95._20_4_;
                auVar157._20_4_ =
                     (float)(uVar176 ^
                            (uint)(fVar175 * auVar52._20_4_ +
                                  fVar187 * auVar53._20_4_ + fVar196 * auVar54._20_4_));
                uVar178 = auVar95._24_4_;
                auVar157._24_4_ =
                     (float)(uVar178 ^
                            (uint)(fVar177 * auVar52._24_4_ +
                                  fVar188 * auVar53._24_4_ + fVar197 * auVar54._24_4_));
                uVar179 = auVar95._28_4_;
                auVar157._28_4_ =
                     (float)(uVar179 ^ (uint)(auVar118._28_4_ + auVar96._28_4_ + auVar119._28_4_));
                auVar161._0_4_ =
                     (float)(uVar80 ^ (uint)(auVar52._0_4_ * fVar104 +
                                            auVar53._0_4_ * fVar100 + fVar102 * auVar54._0_4_));
                auVar161._4_4_ =
                     (float)(uVar168 ^
                            (uint)(auVar52._4_4_ * fVar127 +
                                  auVar53._4_4_ * fVar125 + fVar126 * auVar54._4_4_));
                auVar161._8_4_ =
                     (float)(uVar170 ^
                            (uint)(auVar52._8_4_ * fVar8 +
                                  auVar53._8_4_ * fVar89 + fVar97 * auVar54._8_4_));
                auVar161._12_4_ =
                     (float)(uVar172 ^
                            (uint)(auVar52._12_4_ * fVar17 +
                                  auVar53._12_4_ * fVar15 + fVar16 * auVar54._12_4_));
                auVar161._16_4_ =
                     (float)(uVar174 ^
                            (uint)(auVar52._16_4_ * fVar26 +
                                  auVar53._16_4_ * fVar24 + fVar25 * auVar54._16_4_));
                auVar161._20_4_ =
                     (float)(uVar176 ^
                            (uint)(auVar52._20_4_ * fVar35 +
                                  auVar53._20_4_ * fVar33 + fVar34 * auVar54._20_4_));
                auVar161._24_4_ =
                     (float)(uVar178 ^
                            (uint)(auVar52._24_4_ * fVar44 +
                                  auVar53._24_4_ * fVar42 + fVar43 * auVar54._24_4_));
                auVar161._28_4_ =
                     (float)(uVar179 ^ (uint)(local_a80._28_4_ + auVar53._28_4_ + auVar54._28_4_));
                auVar118 = ZEXT1232(ZEXT812(0)) << 0x20;
                auVar95 = vcmpps_avx(auVar157,auVar118,5);
                auVar118 = vcmpps_avx(auVar161,auVar118,5);
                auVar95 = vandps_avx(auVar95,auVar118);
                auVar96._8_4_ = 0x7fffffff;
                auVar96._0_8_ = 0x7fffffff7fffffff;
                auVar96._12_4_ = 0x7fffffff;
                auVar96._16_4_ = 0x7fffffff;
                auVar96._20_4_ = 0x7fffffff;
                auVar96._24_4_ = 0x7fffffff;
                auVar96._28_4_ = 0x7fffffff;
                local_920 = vandps_avx(auVar149,auVar96);
                auVar118 = vcmpps_avx(auVar149,ZEXT1232(ZEXT812(0)) << 0x20,4);
                auVar95 = vandps_avx(auVar95,auVar118);
                auVar136._0_4_ = auVar161._0_4_ + auVar157._0_4_;
                auVar136._4_4_ = auVar161._4_4_ + auVar157._4_4_;
                auVar136._8_4_ = auVar161._8_4_ + auVar157._8_4_;
                auVar136._12_4_ = auVar161._12_4_ + auVar157._12_4_;
                auVar136._16_4_ = auVar161._16_4_ + auVar157._16_4_;
                auVar136._20_4_ = auVar161._20_4_ + auVar157._20_4_;
                auVar136._24_4_ = auVar161._24_4_ + auVar157._24_4_;
                auVar136._28_4_ = auVar161._28_4_ + auVar157._28_4_;
                auVar96 = vcmpps_avx(auVar136,local_920,2);
                auVar118 = vandps_avx(auVar95,auVar96);
                auVar119 = local_9e0 & auVar118;
                if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar119 >> 0x7f,0) != '\0') ||
                      (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar119 >> 0xbf,0) != '\0') ||
                    (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar119[0x1f] < '\0') {
                  auVar118 = vandps_avx(auVar118,local_9e0);
                  local_940._0_4_ =
                       (float)(uVar80 ^ (uint)(fVar124 * fVar121 +
                                              fVar123 * fVar103 + fVar101 * fVar122));
                  local_940._4_4_ =
                       (float)(uVar168 ^
                              (uint)(fVar143 * fVar140 + fVar142 * fVar139 + fVar138 * fVar141));
                  local_940._8_4_ =
                       (float)(uVar170 ^ (uint)(fVar14 * fVar11 + fVar13 * fVar10 + fVar9 * fVar12))
                  ;
                  local_940._12_4_ =
                       (float)(uVar172 ^ (uint)(fVar23 * fVar20 + fVar22 * fVar19 + fVar18 * fVar21)
                              );
                  local_940._16_4_ =
                       (float)(uVar174 ^ (uint)(fVar32 * fVar29 + fVar31 * fVar28 + fVar27 * fVar30)
                              );
                  local_940._20_4_ =
                       (float)(uVar176 ^ (uint)(fVar41 * fVar38 + fVar40 * fVar37 + fVar36 * fVar39)
                              );
                  local_940._24_4_ =
                       (float)(uVar178 ^ (uint)(fVar50 * fVar47 + fVar49 * fVar46 + fVar45 * fVar48)
                              );
                  local_940._28_4_ =
                       uVar179 ^ (uint)(auVar51._28_4_ + auVar96._28_4_ + auVar95._28_4_);
                  fVar112 = (ray->org).field_0.m128[3];
                  fVar98 = local_920._0_4_;
                  fVar99 = local_920._4_4_;
                  auVar65._4_4_ = fVar99 * fVar112;
                  auVar65._0_4_ = fVar98 * fVar112;
                  fVar100 = local_920._8_4_;
                  auVar65._8_4_ = fVar100 * fVar112;
                  fVar102 = local_920._12_4_;
                  auVar65._12_4_ = fVar102 * fVar112;
                  fVar104 = local_920._16_4_;
                  auVar65._16_4_ = fVar104 * fVar112;
                  fVar101 = local_920._20_4_;
                  auVar65._20_4_ = fVar101 * fVar112;
                  fVar103 = local_920._24_4_;
                  auVar65._24_4_ = fVar103 * fVar112;
                  auVar65._28_4_ = fVar112;
                  auVar95 = vcmpps_avx(auVar65,local_940,1);
                  fVar112 = ray->tfar;
                  auVar66._4_4_ = fVar99 * fVar112;
                  auVar66._0_4_ = fVar98 * fVar112;
                  auVar66._8_4_ = fVar100 * fVar112;
                  auVar66._12_4_ = fVar102 * fVar112;
                  auVar66._16_4_ = fVar104 * fVar112;
                  auVar66._20_4_ = fVar101 * fVar112;
                  auVar66._24_4_ = fVar103 * fVar112;
                  auVar66._28_4_ = fVar112;
                  auVar96 = vcmpps_avx(local_940,auVar66,2);
                  auVar95 = vandps_avx(auVar96,auVar95);
                  auVar96 = auVar118 & auVar95;
                  if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar96 >> 0x7f,0) != '\0') ||
                        (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar96 >> 0xbf,0) != '\0') ||
                      (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar96[0x1f] < '\0') {
                    auVar2._0_4_ = ray->tfar;
                    auVar2._4_4_ = ray->mask;
                    auVar2._8_4_ = ray->id;
                    auVar2._12_4_ = ray->flags;
                    local_8e0 = vandps_avx(auVar118,auVar95);
                    uVar80 = vextractps_avx(auVar2,1);
                    auVar95 = vsubps_avx(local_920,auVar161);
                    auVar95 = vblendvps_avx(auVar157,auVar95,local_9a0);
                    auVar96 = vsubps_avx(local_920,auVar157);
                    auVar118 = vblendvps_avx(auVar161,auVar96,local_9a0);
                    uStack_844 = auVar96._28_4_;
                    local_860[0] = fVar124 * (float)local_9c0._0_4_;
                    local_860[1] = fVar143 * (float)local_9c0._4_4_;
                    local_860[2] = fVar14 * fStack_9b8;
                    local_860[3] = fVar23 * fStack_9b4;
                    fStack_850 = fVar32 * fStack_9b0;
                    fStack_84c = fVar41 * fStack_9ac;
                    fStack_848 = fVar50 * fStack_9a8;
                    local_840[0] = fVar123 * (float)local_9c0._0_4_;
                    local_840[1] = fVar142 * (float)local_9c0._4_4_;
                    local_840[2] = fVar13 * fStack_9b8;
                    local_840[3] = fVar22 * fStack_9b4;
                    fStack_830 = fVar31 * fStack_9b0;
                    fStack_82c = fVar40 * fStack_9ac;
                    fStack_828 = fVar49 * fStack_9a8;
                    uStack_824 = uStack_844;
                    local_820[0] = (float)local_9c0._0_4_ * fVar122;
                    local_820[1] = (float)local_9c0._4_4_ * fVar141;
                    local_820[2] = fStack_9b8 * fVar12;
                    local_820[3] = fStack_9b4 * fVar21;
                    fStack_810 = fStack_9b0 * fVar30;
                    fStack_80c = fStack_9ac * fVar39;
                    fStack_808 = fStack_9a8 * fVar48;
                    uStack_804 = uStack_844;
                    auVar92 = vpshufd_avx(ZEXT416(uVar81),0);
                    auVar92 = vpaddd_avx(auVar92,_DAT_01fab9b0);
                    auVar90 = vpshufd_avx(ZEXT416(uVar82),0);
                    auVar147._0_4_ = (float)(int)(*(ushort *)(local_b50 + 8 + lVar78) - 1);
                    auVar147._4_12_ = auVar52._4_12_;
                    auVar90 = vpaddd_avx(auVar90,_DAT_01fab9c0);
                    auVar150 = vrcpss_avx(auVar147,auVar147);
                    auVar164._0_4_ = (float)(int)(*(ushort *)(local_b50 + 10 + lVar78) - 1);
                    auVar164._4_12_ = auVar52._4_12_;
                    auVar128 = vrcpss_avx(auVar164,auVar164);
                    auVar120._16_16_ = auVar92;
                    auVar120._0_16_ = auVar92;
                    auVar96 = vcvtdq2ps_avx(auVar120);
                    auVar92 = ZEXT416((uint)(auVar150._0_4_ *
                                            (2.0 - auVar150._0_4_ * auVar147._0_4_)));
                    auVar92 = vshufps_avx(auVar92,auVar92,0);
                    fVar112 = (fVar98 * auVar96._0_4_ + auVar95._0_4_) * auVar92._0_4_;
                    fVar121 = (fVar99 * auVar96._4_4_ + auVar95._4_4_) * auVar92._4_4_;
                    local_980._4_4_ = fVar121;
                    local_980._0_4_ = fVar112;
                    fVar122 = (fVar100 * auVar96._8_4_ + auVar95._8_4_) * auVar92._8_4_;
                    local_980._8_4_ = fVar122;
                    fVar123 = (fVar102 * auVar96._12_4_ + auVar95._12_4_) * auVar92._12_4_;
                    local_980._12_4_ = fVar123;
                    fVar124 = (fVar104 * auVar96._16_4_ + auVar95._16_4_) * auVar92._0_4_;
                    local_980._16_4_ = fVar124;
                    fVar125 = (fVar101 * auVar96._20_4_ + auVar95._20_4_) * auVar92._4_4_;
                    local_980._20_4_ = fVar125;
                    fVar126 = (fVar103 * auVar96._24_4_ + auVar95._24_4_) * auVar92._8_4_;
                    local_980._24_4_ = fVar126;
                    local_980._28_4_ = auVar96._28_4_ + auVar95._28_4_;
                    auVar137._16_16_ = auVar90;
                    auVar137._0_16_ = auVar90;
                    auVar95 = vcvtdq2ps_avx(auVar137);
                    auVar92 = ZEXT416((uint)(auVar128._0_4_ *
                                            (2.0 - auVar128._0_4_ * auVar164._0_4_)));
                    auVar92 = vshufps_avx(auVar92,auVar92,0);
                    fVar127 = (fVar98 * auVar95._0_4_ + auVar118._0_4_) * auVar92._0_4_;
                    fVar138 = (fVar99 * auVar95._4_4_ + auVar118._4_4_) * auVar92._4_4_;
                    local_960._4_4_ = fVar138;
                    local_960._0_4_ = fVar127;
                    fVar139 = (fVar100 * auVar95._8_4_ + auVar118._8_4_) * auVar92._8_4_;
                    local_960._8_4_ = fVar139;
                    fVar140 = (fVar102 * auVar95._12_4_ + auVar118._12_4_) * auVar92._12_4_;
                    local_960._12_4_ = fVar140;
                    fVar141 = (fVar104 * auVar95._16_4_ + auVar118._16_4_) * auVar92._0_4_;
                    local_960._16_4_ = fVar141;
                    fVar142 = (fVar101 * auVar95._20_4_ + auVar118._20_4_) * auVar92._4_4_;
                    local_960._20_4_ = fVar142;
                    fVar143 = (fVar103 * auVar95._24_4_ + auVar118._24_4_) * auVar92._8_4_;
                    local_960._24_4_ = fVar143;
                    local_960._28_4_ = auVar95._28_4_ + auVar118._28_4_;
                    if ((local_be0->mask & uVar80) != 0) {
                      pRVar7 = context->args;
                      if ((pRVar7->filter == (RTCFilterFunctionN)0x0) &&
                         (local_be0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002cd782:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      local_ac0._0_8_ = pRVar7;
                      auVar95 = vrcpps_avx(local_920);
                      fVar89 = auVar95._0_4_;
                      fVar97 = auVar95._4_4_;
                      auVar67._4_4_ = fVar99 * fVar97;
                      auVar67._0_4_ = fVar98 * fVar89;
                      fVar98 = auVar95._8_4_;
                      auVar67._8_4_ = fVar100 * fVar98;
                      fVar99 = auVar95._12_4_;
                      auVar67._12_4_ = fVar102 * fVar99;
                      fVar100 = auVar95._16_4_;
                      auVar67._16_4_ = fVar104 * fVar100;
                      fVar102 = auVar95._20_4_;
                      auVar67._20_4_ = fVar101 * fVar102;
                      fVar104 = auVar95._24_4_;
                      auVar67._24_4_ = fVar103 * fVar104;
                      auVar67._28_4_ = local_920._28_4_;
                      auVar158._8_4_ = 0x3f800000;
                      auVar158._0_8_ = 0x3f8000003f800000;
                      auVar158._12_4_ = 0x3f800000;
                      auVar158._16_4_ = 0x3f800000;
                      auVar158._20_4_ = 0x3f800000;
                      auVar158._24_4_ = 0x3f800000;
                      auVar158._28_4_ = 0x3f800000;
                      auVar118 = vsubps_avx(auVar158,auVar67);
                      fVar89 = fVar89 + fVar89 * auVar118._0_4_;
                      fVar97 = fVar97 + fVar97 * auVar118._4_4_;
                      fVar98 = fVar98 + fVar98 * auVar118._8_4_;
                      fVar99 = fVar99 + fVar99 * auVar118._12_4_;
                      fVar100 = fVar100 + fVar100 * auVar118._16_4_;
                      fVar102 = fVar102 + fVar102 * auVar118._20_4_;
                      fVar104 = fVar104 + fVar104 * auVar118._24_4_;
                      local_880[0] = fVar89 * local_940._0_4_;
                      local_880[1] = fVar97 * local_940._4_4_;
                      local_880[2] = fVar98 * local_940._8_4_;
                      local_880[3] = fVar99 * local_940._12_4_;
                      fStack_870 = fVar100 * local_940._16_4_;
                      fStack_86c = fVar102 * local_940._20_4_;
                      fStack_868 = fVar104 * local_940._24_4_;
                      uStack_864 = local_940._28_4_;
                      local_8c0._4_4_ = fVar121 * fVar97;
                      local_8c0._0_4_ = fVar112 * fVar89;
                      local_8c0._8_4_ = fVar122 * fVar98;
                      local_8c0._12_4_ = fVar123 * fVar99;
                      local_8c0._16_4_ = fVar124 * fVar100;
                      local_8c0._20_4_ = fVar125 * fVar102;
                      local_8c0._24_4_ = fVar126 * fVar104;
                      local_8c0._28_4_ = local_940._28_4_;
                      local_8a0._4_4_ = fVar138 * fVar97;
                      local_8a0._0_4_ = fVar127 * fVar89;
                      local_8a0._8_4_ = fVar139 * fVar98;
                      local_8a0._12_4_ = fVar140 * fVar99;
                      local_8a0._16_4_ = fVar141 * fVar100;
                      local_8a0._20_4_ = fVar142 * fVar102;
                      local_8a0._24_4_ = fVar143 * fVar104;
                      local_8a0._28_4_ = auVar95._28_4_ + auVar118._28_4_;
                      iVar74 = vmovmskps_avx(local_8e0);
                      uVar72 = CONCAT44((int)((ulong)pRVar7 >> 0x20),iVar74);
                      uVar70 = 0;
                      if (uVar72 != 0) {
                        for (; (uVar72 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                        }
                      }
                      local_aa0._0_8_ = uVar72;
                      if (iVar74 != 0) {
                        local_a80._0_8_ = context->user;
                        local_ae0._0_4_ = ray->tfar;
                        do {
                          local_b34 = *(undefined4 *)(local_8c0 + uVar70 * 4);
                          local_b30 = local_880[uVar70 - 8];
                          ray->tfar = local_880[uVar70];
                          local_b40 = local_860[uVar70];
                          local_b3c = local_840[uVar70];
                          local_b38 = local_820[uVar70];
                          local_b24 = *(uint *)local_a80._0_8_;
                          local_b20 = *(uint *)(local_a80._0_8_ + 4);
                          local_be4 = -1;
                          local_b10.valid = &local_be4;
                          local_b10.geometryUserPtr = local_be0->userPtr;
                          local_b10.context = (RTCRayQueryContext *)local_a80._0_8_;
                          local_b10.hit = (RTCHitN *)&local_b40;
                          local_b10.N = 1;
                          local_b2c = uVar5;
                          local_b28 = uVar79;
                          local_b10.ray = (RTCRayN *)ray;
                          if ((local_be0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*local_be0->occlusionFilterN)(&local_b10), *local_b10.valid != 0)) {
                            if ((*(code **)(local_ac0._0_8_ + 0x10) == (code *)0x0) ||
                               ((((*(byte *)local_ac0._0_8_ & 2) == 0 &&
                                 (((local_be0->field_8).field_0x2 & 0x40) == 0)) ||
                                ((**(code **)(local_ac0._0_8_ + 0x10))(&local_b10),
                                *local_b10.valid != 0)))) goto LAB_002cd782;
                          }
                          ray->tfar = (float)local_ae0._0_4_;
                          uVar72 = local_aa0._0_8_ ^ 1L << (uVar70 & 0x3f);
                          uVar70 = 0;
                          if (uVar72 != 0) {
                            for (; (uVar72 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                            }
                          }
                          local_aa0._0_8_ = uVar72;
                        } while (uVar72 != 0);
                      }
                    }
                  }
                }
                uVar88 = uVar88 & uVar88 - 1;
              } while (uVar88 != 0);
            }
            local_b68 = local_b68 + 1;
            auVar160 = ZEXT1664(local_9f0);
            auVar162 = ZEXT1664(local_a00);
            auVar166 = ZEXT1664(local_a10);
            auVar182 = ZEXT1664(local_a20);
            auVar191 = ZEXT1664(local_a30);
            auVar199 = ZEXT1664(local_a40);
            auVar201 = ZEXT1664(local_a50);
            auVar203 = ZEXT1664(local_a60);
          } while (local_b68 != local_b70);
        }
        uVar88 = local_bc8;
        uVar70 = local_bb0;
        uVar72 = local_bb8;
        uVar83 = local_bc0;
        uVar84 = local_bd8;
        uVar87 = local_bd0;
      } while (local_ba8 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }